

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

unit_data units::precise::custom::custom_unit(uint16_t customX)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  int32_t moles;
  int iVar7;
  int iVar8;
  uint per_unit;
  uint iflag;
  uint eflag;
  unit_data local_2c;
  uint16_t customX_local;
  
  iVar1 = bShift(customX,8);
  iVar2 = bShift(customX,7);
  iVar3 = bShift(customX,9);
  iVar4 = detail::maxNeg(3);
  iVar5 = bShift(customX,6);
  iVar6 = bShift(customX,4);
  moles = detail::maxNeg(2);
  iVar7 = bShift(customX,5);
  iVar8 = bShift(customX,3);
  per_unit = bShiftu(customX,2);
  iflag = bShiftu(customX,1);
  eflag = bShiftu(customX,0);
  detail::unit_data::unit_data
            (&local_2c,iVar1 * -4 + 7,iVar2 * 3 + -2,iVar3 * 7,(iVar4 + 1) - iVar5,iVar6 * 3,moles,
             iVar7 * 2 + -2,iVar8 * -2,0,0,per_unit,iflag,eflag,0);
  return local_2c;
}

Assistant:

constexpr detail::unit_data custom_unit(std::uint16_t customX)
        {
            return {
                7 - 4 * bShift(customX, 8U),  // 3 or 7
                -2 + 3 * bShift(customX, 7U),  // -2 or 1
                // 7 or 0  sometimes custom unit/time is used
                7 * bShift(customX, 9U),
                // -3 or -4  this is probably the most important for
                // identifying custom units
                detail::maxNeg(detail::bitwidth::ampere) + 1 -
                    bShift(customX, 6U),
                3 * bShift(customX, 4U),  // 3 or 0
                detail::maxNeg(detail::bitwidth::mole),  // this also is set so
                                                         // that 1/-2 = -2 for a
                                                         // 2 bit signed number
                -2 + 2 * bShift(customX, 5U),
                -2 * bShift(customX, 3U),
                0,
                0,
                bShiftu(customX, 2U),
                bShiftu(customX, 1U),
                bShiftu(customX, 0U),
                0};
        }